

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Cec_ManLSCorrespondenceBmc(Gia_Man_t *pAig,Cec_ParCor_t *pPars,int nPrefs)

{
  Vec_Str_t *pVVar1;
  Gia_Man_t *pSim;
  int iVar2;
  Gia_Man_t *pAig_00;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  Gia_Man_t *p;
  Vec_Int_t **pvOutputs;
  int in_R9D;
  bool bVar6;
  Vec_Str_t *vStatus;
  Vec_Int_t *vOutputs;
  timespec ts;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t ParsSim;
  Vec_Str_t *local_d8;
  Vec_Int_t *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  Gia_Man_t *local_b8;
  Gia_Man_t *local_b0;
  timespec local_a8;
  Cec_ParCor_t *local_98;
  ulong local_90;
  Cec_ParSat_t local_84;
  Cec_ParSim_t local_60;
  
  Cec_ManSimSetDefaultParams(&local_60);
  local_60.nWords = pPars->nWords;
  local_60.nFrames = pPars->nRounds;
  local_60.fVerbose = pPars->fVerbose;
  local_60.fLatchCorr = pPars->fLatchCorr;
  local_60.fSeqSimulate = 1;
  local_b0 = pAig;
  local_b8 = (Gia_Man_t *)Cec_ManSimStart(pAig,&local_60);
  Cec_ManSatSetDefaultParams(&local_84);
  local_84.nBTLimit = pPars->nBTLimit;
  local_84.fVerbose = pPars->fVerbose;
  local_c4 = nPrefs + 1;
  bVar6 = true;
  local_98 = pPars;
  local_90 = (ulong)(uint)nPrefs;
  do {
    if (!bVar6) break;
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_a8.tv_sec * -1000000;
    }
    pvOutputs = &local_d0;
    pAig_00 = Gia_ManCorrSpecReduceInit
                        (local_b0,pPars->nFrames,(int)local_90,(uint)(pPars->fLatchCorr == 0),
                         pvOutputs,in_R9D);
    iVar2 = (int)pvOutputs;
    local_bc = pAig_00->vCos->nSize;
    local_c0 = pAig_00->nRegs;
    if (local_bc == local_c0) {
      Gia_ManStop(pAig_00);
      pVVar3 = local_d0;
      if (local_d0->pArray != (int *)0x0) {
        free(local_d0->pArray);
        pVVar3->pArray = (int *)0x0;
      }
      bVar6 = false;
    }
    else {
      local_84.nBTLimit = local_84.nBTLimit * 10;
      if (pPars->fUseCSat == 0) {
        pVVar3 = Cec_ManSatSolveMiter(pAig_00,&local_84,&local_d8);
      }
      else {
        pVVar3 = Tas_ManSolveMiterNc(pAig_00,pPars->nBTLimit,&local_d8,0);
      }
      pSim = local_b8;
      bVar6 = pVVar3->nSize != 0;
      if (bVar6) {
        p = local_b8;
        Cec_ManResimulateCounterExamples((Cec_ManSim_t *)local_b8,pVVar3,pPars->nFrames + local_c4);
        Gia_ManCheckRefinements(p,local_d8,local_d0,(Cec_ManSim_t *)pSim,iVar2);
      }
      pVVar1 = local_d8;
      if (pPars->fVerbose != 0) {
        iVar2 = clock_gettime(3,&local_a8);
        if (iVar2 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Cec_ManRefinedClassPrintStats(local_b0,pVVar1,-1,lVar4 + lVar5);
      }
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (int *)0x0;
      }
      if (pVVar3 != (Vec_Int_t *)0x0) {
        free(pVVar3);
      }
      pVVar1 = local_d8;
      if (local_d8->pArray != (char *)0x0) {
        free(local_d8->pArray);
        pVVar1->pArray = (char *)0x0;
      }
      if (pVVar1 != (Vec_Str_t *)0x0) {
        free(pVVar1);
      }
      Gia_ManStop(pAig_00);
      pVVar3 = local_d0;
      pPars = local_98;
      if (local_d0->pArray != (int *)0x0) {
        free(local_d0->pArray);
        pVVar3->pArray = (int *)0x0;
        pPars = local_98;
      }
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
  } while (local_bc != local_c0);
  Cec_ManSimStop((Cec_ManSim_t *)local_b8);
  return;
}

Assistant:

void Cec_ManLSCorrespondenceBmc( Gia_Man_t * pAig, Cec_ParCor_t * pPars, int nPrefs )
{  
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int fChanges, RetValue;
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr = pPars->fLatchCorr;
    pParsSim->fSeqSimulate = 1;
    pSim = Cec_ManSimStart( pAig, pParsSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    fChanges = 1;
    while ( fChanges )
    {
        abctime clkBmc = Abc_Clock();
        fChanges = 0;
        pSrm = Gia_ManCorrSpecReduceInit( pAig, pPars->nFrames, nPrefs, !pPars->fLatchCorr, &vOutputs, pPars->fUseRings );
        if ( Gia_ManPoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            Vec_IntFree( vOutputs );
            break;
        } 
        pParsSat->nBTLimit *= 10;
        if ( pPars->fUseCSat )
            vCexStore = Tas_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        // refine classes with these counter-examples
        if ( Vec_IntSize(vCexStore) )
        {
            RetValue = Cec_ManResimulateCounterExamples( pSim, vCexStore, pPars->nFrames + 1 + nPrefs );
            Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
            fChanges = 1;
        }
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, -1, Abc_Clock() - clkBmc );
        // recycle
        Vec_IntFree( vCexStore );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        Vec_IntFree( vOutputs );
    }
    Cec_ManSimStop( pSim );
}